

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManMergeContainAll(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  Vec_Int_t *vGroup;
  int local_44;
  long local_40;
  
  if (vGroups->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    local_40 = 0x10;
    local_44 = 1;
    iVar3 = 0;
    do {
      vGroup = vGroups->pArray + lVar4;
      iVar1 = Mop_ManRemoveIdentical(p,vGroup);
      iVar3 = iVar1 + iVar3;
      lVar4 = lVar4 + 1;
      lVar5 = local_40;
      iVar1 = local_44;
      if (lVar4 < vGroups->nSize) {
        do {
          iVar2 = Mop_ManMergeContainTwo
                            (p,vGroup,(Vec_Int_t *)((long)&vGroups->pArray->nCap + lVar5));
          iVar3 = iVar3 + iVar2;
          iVar1 = iVar1 + 1;
          lVar5 = lVar5 + 0x10;
        } while (iVar1 < vGroups->nSize);
      }
      local_40 = local_40 + 0x10;
      local_44 = local_44 + 1;
    } while (lVar4 < vGroups->nSize);
  }
  return iVar3;
}

Assistant:

int Mop_ManMergeContainAll( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, Count = 0;
    Vec_WecForEachLevel( vGroups, vGroup, i )
    {
        Count += Mop_ManRemoveIdentical( p, vGroup );
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            Count += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    }
    return Count;
}